

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O0

Matrix<double,__1,_1,_0,__1,_1> * __thiscall
dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::setTcopy
          (Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *this,
          Matrix<double,__1,_1,_0,__1,_1> *t)

{
  Matrix<double,__1,_1,_0,__1,_1> *t_local;
  Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *this_local;
  
  if (this->Tcopy == &this->Tcopy1) {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(&this->Tcopy2,t);
    this->copyInit = true;
    this->Tcopy = &this->Tcopy2;
    this_local = (Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *)&this->Tcopy2;
  }
  else {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(&this->Tcopy1,t);
    this->copyInit = true;
    this->Tcopy = &this->Tcopy1;
    this_local = (Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *)&this->Tcopy1;
  }
  return (Matrix<double,__1,_1,_0,__1,_1> *)this_local;
}

Assistant:

const T &Signal<T, Time>::setTcopy(const T &t) {
  if (Tcopy == &Tcopy1) {
    Tcopy2 = t;
    copyInit = true;
    Tcopy = &Tcopy2;
    return Tcopy2;
  } else {
    Tcopy1 = t;
    copyInit = true;
    Tcopy = &Tcopy1;
    return Tcopy1;
  }
}